

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O0

void __thiscall diy::MemoryBuffer::MemoryBuffer(MemoryBuffer *this,MemoryBuffer *param_2)

{
  vector<char,_std::allocator<char>_> *in_RSI;
  vector<char,_std::allocator<char>_> *in_RDI;
  
  BinaryBuffer::BinaryBuffer((BinaryBuffer *)in_RDI,(BinaryBuffer *)in_RSI);
  *(undefined ***)&(in_RDI->super__Vector_base<char,_std::allocator<char>_>)._M_impl =
       &PTR__MemoryBuffer_001a74a8;
  *(undefined8 *)&(in_RDI->super__Vector_base<char,_std::allocator<char>_>)._M_impl.field_0x8 =
       *(undefined8 *)&(in_RSI->super__Vector_base<char,_std::allocator<char>_>)._M_impl.field_0x8;
  std::vector<char,_std::allocator<char>_>::vector(in_RSI,in_RDI);
  *(undefined8 *)&in_RDI[1].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10 =
       *(undefined8 *)&in_RSI[1].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10;
  std::vector<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>::vector
            ((vector<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_> *)in_RSI,
             (vector<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_> *)in_RDI);
  return;
}

Assistant:

MemoryBuffer(MemoryBuffer&&)                =default;